

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O2

Inet_addr * __thiscall iqnet::Socket::get_addr(Inet_addr *__return_storage_ptr__,Socket *this)

{
  int iVar1;
  network_error *this_00;
  allocator<char> local_4d;
  socklen_t saddr_len;
  sockaddr_in saddr;
  string local_38;
  
  saddr_len = 0x10;
  iVar1 = getsockname(this->sock,(sockaddr *)&saddr,&saddr_len);
  if (iVar1 != -1) {
    Inet_addr::Inet_addr(__return_storage_ptr__,&saddr);
    return __return_storage_ptr__;
  }
  this_00 = (network_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Socket::get_addr",&local_4d);
  network_error::network_error(this_00,&local_38,true,0);
  __cxa_throw(this_00,&network_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Inet_addr Socket::get_addr() const
{
  sockaddr_in saddr;
  socklen_t saddr_len = sizeof(saddr);

  if (::getsockname(sock, reinterpret_cast<sockaddr*>(&saddr), &saddr_len) == -1)
    throw network_error( "Socket::get_addr" );

  return Inet_addr(reinterpret_cast<const sockaddr_in&>(saddr));
}